

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureUnitCase::init(TextureUnitCase *this,EVP_PKEY_CTX *ctx)

{
  int cellSize;
  deBool dVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int extraout_EAX;
  ContextInfo *pCVar5;
  TestLog *this_00;
  MessageBuilder *this_01;
  size_type sVar6;
  Texture2D *this_02;
  TextureCube *this_03;
  reference ppTVar7;
  reference ppTVar8;
  iterator first;
  reference pvVar9;
  reference __x;
  MultiTexShader *this_04;
  float fVar10;
  PixelBufferAccess *local_518;
  TextureFormat *local_4f0;
  int local_484;
  bool local_471;
  bool local_46a;
  bool local_469;
  int local_444;
  exception *anon_var_0;
  undefined1 local_428 [4];
  int i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unitTypes;
  int local_400;
  value_type_conflict1 local_3fc;
  RGBA local_3f8;
  int i;
  Vector<float,_4> local_3e4;
  Vec4 local_3d4;
  RGBA local_3c4;
  Vector<float,_4> local_3c0;
  Vector<float,_4> local_3b0;
  Vec4 local_3a0;
  undefined1 local_390 [8];
  PixelBufferAccess access;
  int local_360;
  int curCellSize;
  int levelNdx;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 alpha1;
  deUint32 alpha0;
  deUint32 rgb;
  int face;
  int numFaces;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  TextureCube *local_2d8;
  value_type_conflict1 local_2cc;
  TextureFormat local_2c8;
  Texture2D *local_2c0;
  value_type_conflict1 local_2b8;
  int local_2b4;
  bool local_2ad;
  int numLevels;
  int iStack_2a8;
  bool mipmaps;
  int texHeight;
  int texWidth;
  GLenum type;
  deUint32 dStack_298;
  bool is2d;
  TextureParameters params;
  int texNdx;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  char *local_1c0;
  MessageBuilder local_1b8;
  undefined1 local_34 [8];
  Random rnd;
  TestLog *log;
  TextureUnitCase *this_local;
  
  if (this->m_numUnitsParam < 1) {
    pCVar5 = gles2::Context::getContextInfo((this->super_TestCase).m_context);
    local_444 = (*pCVar5->_vptr_ContextInfo[2])(pCVar5,0x8872);
  }
  else {
    local_444 = this->m_numUnitsParam;
  }
  this->m_numUnits = local_444;
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  de::Random::Random((Random *)local_34,this->m_randSeed);
  fVar10 = de::Random::getFloat((Random *)local_34);
  if (0.7 <= fVar10) {
    iVar2 = ::deMax32(1,this->m_numUnits + -2);
    iVar2 = de::Random::getInt((Random *)local_34,iVar2,this->m_numUnits);
    this->m_numTextures = iVar2;
  }
  else {
    this->m_numTextures = this->m_numUnits;
  }
  tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  de::toString<int>(&local_260,&this->m_numUnits);
  std::operator+(&local_240,"Using ",&local_260);
  std::operator+(&local_220,&local_240," texture unit(s) and ");
  de::toString<int>((string *)&params.magFilter,&this->m_numTextures);
  std::operator+(&local_200,&local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &params.magFilter);
  std::operator+(&local_1e0,&local_200," texture(s)");
  local_1c0 = (char *)std::__cxx11::string::c_str();
  this_01 = tcu::MessageBuilder::operator<<(&local_1b8,&local_1c0);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&params.magFilter);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->m_textureTypes,(long)this->m_numTextures);
  std::
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
  ::reserve(&this->m_textureParams,(long)this->m_numTextures);
  std::vector<int,_std::allocator<int>_>::reserve(&this->m_ndx2dOrCube,(long)this->m_numTextures);
  for (params.minFilter = 0; (int)params.minFilter < this->m_numTextures;
      params.minFilter = params.minFilter + 1) {
    if (this->m_caseType == CASE_ONLY_2D) {
      local_469 = true;
    }
    else {
      if (this->m_caseType == CASE_ONLY_CUBE) {
        local_46a = false;
      }
      else {
        local_46a = de::Random::getBool((Random *)local_34);
      }
      local_469 = local_46a;
    }
    texWidth._3_1_ = local_469;
    texHeight = 0x8513;
    if (local_469 != false) {
      texHeight = 0xde1;
    }
    iStack_2a8 = ((byte)~local_469 & 1) * 0x80 + 0x80;
    numLevels = ((byte)~local_469 & 1) * 0x80 + 0x80;
    dVar1 = ::deIsPowerOfTwo32(iStack_2a8);
    local_471 = false;
    if (dVar1 != 0) {
      dVar1 = ::deIsPowerOfTwo32(numLevels);
      local_471 = dVar1 != 0;
    }
    local_2ad = local_471;
    if (local_471 == false) {
      local_484 = 1;
    }
    else {
      iVar2 = de::max<int>(iStack_2a8,numLevels);
      local_484 = ::deLog2Floor32(iVar2);
      local_484 = local_484 + 1;
    }
    local_2b4 = local_484;
    iVar2 = de::Random::getInt((Random *)local_34,0,2);
    params.format = *(GLenum *)(s_testWrapModes + (long)iVar2 * 4);
    iVar2 = de::Random::getInt((Random *)local_34,0,2);
    params.dataType = *(GLenum *)(s_testWrapModes + (long)iVar2 * 4);
    iVar2 = de::Random::getInt((Random *)local_34,0,1);
    params.wrapModeT = *(GLenum *)((long)&s_testMagFilters + (long)iVar2 * 4);
    iVar2 = de::Random::getInt((Random *)local_34,0,3);
    dStack_298 = *(deUint32 *)(s_testDataTypes + (long)iVar2 * 4);
    if ((local_2ad & 1U) == 0) {
      iVar2 = de::Random::getInt((Random *)local_34,0,1);
      params.wrapModeS = *(GLenum *)((long)&s_testNonMipmapMinFilters + (long)iVar2 * 4);
    }
    else {
      iVar2 = de::Random::getInt((Random *)local_34,0,5);
      params.wrapModeS = *(GLenum *)(s_testMinFilters + (long)iVar2 * 4);
    }
    if (dStack_298 == 0x8363) {
      type = 0x1907;
    }
    else if ((dStack_298 == 0x8033) || (dStack_298 == 0x8034)) {
      type = 0x1908;
    }
    else {
      iVar2 = de::Random::getInt((Random *)local_34,0,4);
      type = *(GLenum *)(s_testFormats + (long)iVar2 * 4);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->m_textureTypes,(value_type_conflict4 *)&texHeight);
    std::
    vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
    ::push_back(&this->m_textureParams,(value_type *)&type);
    if ((texWidth._3_1_ & 1) == 0) {
      sVar6 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::size
                        (&this->m_texturesCube);
      local_2cc = (value_type_conflict1)sVar6;
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_ndx2dOrCube,&local_2cc);
      this_03 = (TextureCube *)operator_new(0x168);
      fmtInfo.lookupBias.m_data._8_8_ = glu::mapGLTransferFormat(type,dStack_298);
      tcu::TextureCube::TextureCube
                (this_03,(TextureFormat *)(fmtInfo.lookupBias.m_data + 2),iStack_2a8);
      local_2d8 = this_03;
      std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::push_back
                (&this->m_texturesCube,&local_2d8);
    }
    else {
      sVar6 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::size
                        (&this->m_textures2d);
      local_2b8 = (value_type_conflict1)sVar6;
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_ndx2dOrCube,&local_2b8);
      this_02 = (Texture2D *)operator_new(0x50);
      local_2c8 = glu::mapGLTransferFormat(type,dStack_298);
      tcu::Texture2D::Texture2D(this_02,&local_2c8,iStack_2a8,numLevels);
      local_2c0 = this_02;
      std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::push_back
                (&this->m_textures2d,&local_2c0);
    }
    if ((texWidth._3_1_ & 1) == 0) {
      ppTVar8 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::back
                          (&this->m_texturesCube);
      local_4f0 = tcu::TextureCube::getFormat(*ppTVar8);
    }
    else {
      ppTVar7 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::back
                          (&this->m_textures2d);
      local_4f0 = tcu::TextureLevelPyramid::getFormat(&(*ppTVar7)->super_TextureLevelPyramid);
    }
    tcu::getTextureFormatInfo((TextureFormatInfo *)(cBias.m_data + 2),local_4f0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
    tcu::operator-((tcu *)&face,(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                   (Vector<float,_4> *)(cBias.m_data + 2));
    iVar2 = 6;
    if ((texWidth._3_1_ & 1) != 0) {
      iVar2 = 1;
    }
    for (alpha0 = 0; (int)alpha0 < iVar2; alpha0 = alpha0 + 1) {
      dVar3 = de::Random::getUint32((Random *)local_34);
      colorA = 0xff000000;
      colorB = 0xff000000;
      if (type == 0x1906) {
        dVar4 = de::Random::getUint32((Random *)local_34);
        colorA = dVar4 & 0xff000000;
        colorB = colorA ^ 0xffffffff;
      }
      for (local_360 = 0; local_360 < local_2b4; local_360 = local_360 + 1) {
        if ((texWidth._3_1_ & 1) == 0) {
          ppTVar8 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::back
                              (&this->m_texturesCube);
          tcu::TextureCube::allocLevel(*ppTVar8,alpha0,local_360);
        }
        else {
          ppTVar7 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::back
                              (&this->m_textures2d);
          tcu::Texture2D::allocLevel(*ppTVar7,local_360);
        }
        access.super_ConstPixelBufferAccess.m_data._4_4_ =
             ::deMax32(1,8 >> ((byte)local_360 & 0x1f));
        if ((texWidth._3_1_ & 1) == 0) {
          ppTVar8 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::back
                              (&this->m_texturesCube);
          local_518 = tcu::TextureCube::getLevelFace(*ppTVar8,local_360,alpha0);
        }
        else {
          ppTVar7 = std::vector<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>::back
                              (&this->m_textures2d);
          local_518 = tcu::TextureLevelPyramid::getLevel
                                (&(*ppTVar7)->super_TextureLevelPyramid,local_360);
        }
        tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_390,local_518);
        cellSize = access.super_ConstPixelBufferAccess.m_data._4_4_;
        tcu::RGBA::RGBA(&local_3c4,colorA | dVar3 & 0xffffff);
        tcu::RGBA::toVec((RGBA *)&local_3c0);
        tcu::operator*((tcu *)&local_3b0,&local_3c0,(Vector<float,_4> *)&face);
        tcu::operator+((tcu *)&local_3a0,&local_3b0,(Vector<float,_4> *)(cScale.m_data + 2));
        tcu::RGBA::RGBA(&local_3f8,colorB | dVar3 & 0xffffff ^ 0xffffffff);
        tcu::RGBA::toVec((RGBA *)&i);
        tcu::operator*((tcu *)&local_3e4,(Vector<float,_4> *)&i,(Vector<float,_4> *)&face);
        tcu::operator+((tcu *)&local_3d4,&local_3e4,(Vector<float,_4> *)(cScale.m_data + 2));
        tcu::fillWithGrid((PixelBufferAccess *)local_390,cellSize,&local_3a0,&local_3d4);
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->m_unitTextures,(long)this->m_numUnits);
  for (local_3fc = 0; local_3fc < this->m_numTextures; local_3fc = local_3fc + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_unitTextures,&local_3fc);
  }
  while (sVar6 = std::vector<int,_std::allocator<int>_>::size(&this->m_unitTextures),
        (int)sVar6 < this->m_numUnits) {
    local_400 = de::Random::getInt((Random *)local_34,0,this->m_numTextures + -1);
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_unitTextures,&local_400);
  }
  first = std::vector<int,_std::allocator<int>_>::begin(&this->m_unitTextures);
  unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end(&this->m_unitTextures);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)local_34,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             unitTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_428);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_428,(long)this->m_numUnits
            );
  for (anon_var_0._4_4_ = 0; anon_var_0._4_4_ < this->m_numUnits;
      anon_var_0._4_4_ = anon_var_0._4_4_ + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_unitTextures,(long)anon_var_0._4_4_);
    __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    (&this->m_textureTypes,(long)*pvVar9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_428,__x);
  }
  this_04 = (MultiTexShader *)operator_new(0x1a0);
  dVar3 = de::Random::getUint32((Random *)local_34);
  MultiTexShader::MultiTexShader
            (this_04,dVar3,this->m_numUnits,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_428);
  this->m_shader = this_04;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_428);
  de::Random::~Random((Random *)local_34);
  return extraout_EAX;
}

Assistant:

void TextureUnitCase::init (void)
{
	m_numUnits = m_numUnitsParam > 0 ? m_numUnitsParam : m_context.getContextInfo().getInt(GL_MAX_TEXTURE_IMAGE_UNITS);

	// Make the textures.

	try
	{
		tcu::TestLog&	log	= m_testCtx.getLog();
		de::Random		rnd	(m_randSeed);

		if (rnd.getFloat() < 0.7f)
			m_numTextures = m_numUnits;											// In most cases use one unit per texture.
		else
			m_numTextures = rnd.getInt(deMax32(1, m_numUnits - 2), m_numUnits);	// Sometimes assign same texture to multiple units.

		log << tcu::TestLog::Message << ("Using " + de::toString(m_numUnits) + " texture unit(s) and " + de::toString(m_numTextures) + " texture(s)").c_str() << tcu::TestLog::EndMessage;

		m_textureTypes.reserve(m_numTextures);
		m_textureParams.reserve(m_numTextures);
		m_ndx2dOrCube.reserve(m_numTextures);

		// Generate textures.

		for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		{
			// Either fixed or randomized target types (2d or cube), and randomized parameters for every texture.

			TextureParameters	params;
			bool				is2d		= m_caseType == CASE_ONLY_2D	? true :
											  m_caseType == CASE_ONLY_CUBE	? false :
																			  rnd.getBool();

			GLenum				type		= is2d ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP;
			const int			texWidth	= is2d ? TEXTURE_WIDTH_2D : TEXTURE_WIDTH_CUBE;
			const int			texHeight	= is2d ? TEXTURE_HEIGHT_2D : TEXTURE_HEIGHT_CUBE;
			bool				mipmaps		= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight));
			int					numLevels	= mipmaps ? deLog2Floor32(de::max(texWidth, texHeight))+1 : 1;

			params.wrapModeS	= s_testWrapModes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeT	= s_testWrapModes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.magFilter	= s_testMagFilters	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMagFilters) - 1)];
			params.dataType		= s_testDataTypes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testDataTypes) - 1)];

			// Certain minification filters are only used when using mipmaps.
			if (mipmaps)
				params.minFilter = s_testMinFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMinFilters) - 1)];
			else
				params.minFilter = s_testNonMipmapMinFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNonMipmapMinFilters) - 1)];

			// Format may depend on data type.
			if (params.dataType == GL_UNSIGNED_SHORT_5_6_5)
				params.format = GL_RGB;
			else if (params.dataType == GL_UNSIGNED_SHORT_4_4_4_4 || params.dataType == GL_UNSIGNED_SHORT_5_5_5_1)
				params.format = GL_RGBA;
			else
				params.format = s_testFormats[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testFormats) - 1)];

			m_textureTypes.push_back(type);
			m_textureParams.push_back(params);

			// Create new texture.

			if (is2d)
			{
				m_ndx2dOrCube.push_back((int)m_textures2d.size()); // Remember the index this texture has in the 2d array.
				m_textures2d.push_back(new tcu::Texture2D(glu::mapGLTransferFormat(params.format, params.dataType), texWidth, texHeight));
			}
			else
			{
				m_ndx2dOrCube.push_back((int)m_texturesCube.size()); // Remember the index this texture has in the cube array.
				DE_ASSERT(texWidth == texHeight);
				m_texturesCube.push_back(new tcu::TextureCube(glu::mapGLTransferFormat(params.format, params.dataType), texWidth));
			}

			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(is2d ? m_textures2d.back()->getFormat() : m_texturesCube.back()->getFormat());
			Vec4					cBias		= fmtInfo.valueMin;
			Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill with grid texture.

			int numFaces = is2d ? 1 : (int)tcu::CUBEFACE_LAST;

			for (int face = 0; face < numFaces; face++)
			{
				deUint32 rgb	= rnd.getUint32() & 0x00ffffff;
				deUint32 alpha0	= 0xff000000;
				deUint32 alpha1	= 0xff000000;

				if (params.format == GL_ALPHA) // \note This needs alpha to be visible.
				{
					alpha0 &= rnd.getUint32();
					alpha1 = ~alpha0;
				}

				deUint32 colorA = alpha0 | rgb;
				deUint32 colorB = alpha1 | ~rgb;

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					if (is2d)
						m_textures2d.back()->allocLevel(levelNdx);
					else
						m_texturesCube.back()->allocLevel((tcu::CubeFace)face, levelNdx);

					int curCellSize = deMax32(1, GRID_CELL_SIZE >> levelNdx); // \note Scale grid cell size for mipmaps.

					tcu::PixelBufferAccess access = is2d ? m_textures2d.back()->getLevel(levelNdx) : m_texturesCube.back()->getLevelFace(levelNdx, (tcu::CubeFace)face);
					tcu::fillWithGrid(access, curCellSize, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}
		}

		// Assign a texture index to each unit.

		m_unitTextures.reserve(m_numUnits);

		// \note Every texture is used at least once.
		for (int i = 0; i < m_numTextures; i++)
			m_unitTextures.push_back(i);

		// Assign a random texture to remaining units.
		while ((int)m_unitTextures.size() < m_numUnits)
			m_unitTextures.push_back(rnd.getInt(0, m_numTextures - 1));

		rnd.shuffle(m_unitTextures.begin(), m_unitTextures.end());

		// Create shader.

		vector<GLenum> unitTypes;
		unitTypes.reserve(m_numUnits);
		for (int i = 0; i < m_numUnits; i++)
			unitTypes.push_back(m_textureTypes[m_unitTextures[i]]);

		DE_ASSERT(m_shader == DE_NULL);
		m_shader = new MultiTexShader(rnd.getUint32(), m_numUnits, unitTypes);
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureUnitCase::deinit();
		throw;
	}
}